

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

bool __thiscall Am_Inter_Location::Translate_To(Am_Inter_Location *this,Am_Object *dest_obj)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  bool local_19;
  bool ok;
  Am_Object *dest_obj_local;
  Am_Inter_Location *this_local;
  
  iVar2 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
  this->data = (Am_Inter_Location_Data *)CONCAT44(extraout_var,iVar2);
  local_19 = true;
  if (this->data != (Am_Inter_Location_Data *)0x0) {
    bVar1 = Am_Object::operator!=(&this->data->ref_obj,dest_obj);
    if (bVar1) {
      local_19 = Am_Translate_Coordinates
                           (&this->data->ref_obj,(this->data->data).rect.left,
                            (this->data->data).rect.top,dest_obj,(int *)&this->data->data,
                            &(this->data->data).rect.top);
      if ((this->data->as_line & 1U) != 0) {
        Am_Translate_Coordinates
                  (&this->data->ref_obj,(this->data->data).rect.width,(this->data->data).rect.height
                   ,dest_obj,&(this->data->data).rect.width,&(this->data->data).rect.height);
      }
      Am_Object::operator=(&this->data->ref_obj,dest_obj);
    }
    return local_19;
  }
  Am_Error("Am_Inter_Location not initialized");
}

Assistant:

bool
Am_Inter_Location::Translate_To(Am_Object dest_obj)
{
  data = (Am_Inter_Location_Data *)data->Make_Unique();
  bool ok = true;
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  if (data->ref_obj != dest_obj) {
    ok = Am_Translate_Coordinates(data->ref_obj, data->data.line.x1,
                                  data->data.line.y1, dest_obj,
                                  data->data.line.x1, data->data.line.y1);
    if (data->as_line)
      Am_Translate_Coordinates(data->ref_obj, data->data.line.x2,
                               data->data.line.y2, dest_obj, data->data.line.x2,
                               data->data.line.y2);
    data->ref_obj = dest_obj;
  }
  return ok;
}